

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O1

void Abc_SclPrintFaninPairs(SC_Man *p,Abc_Ntk_t *pNtk)

{
  Abc_Obj_t *pObj;
  Abc_Obj_t *pFanin;
  Vec_Ptr_t *pVVar1;
  long lVar2;
  long lVar3;
  
  pVVar1 = pNtk->vObjs;
  if (0 < pVVar1->nSize) {
    lVar3 = 0;
    do {
      pObj = (Abc_Obj_t *)pVVar1->pArray[lVar3];
      if (((pObj != (Abc_Obj_t *)0x0) && ((*(uint *)&pObj->field_0x14 & 0xf) == 7)) &&
         (0 < (pObj->vFanins).nSize)) {
        lVar2 = 0;
        do {
          pFanin = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar2]];
          if (((*(uint *)&pFanin->field_0x14 & 0xf) == 7) && ((pFanin->vFanouts).nSize == 1)) {
            Abc_SclCheckCommonInputs(pObj,pFanin);
          }
          lVar2 = lVar2 + 1;
        } while (lVar2 < (pObj->vFanins).nSize);
      }
      lVar3 = lVar3 + 1;
      pVVar1 = pNtk->vObjs;
    } while (lVar3 < pVVar1->nSize);
  }
  return;
}

Assistant:

void Abc_SclPrintFaninPairs( SC_Man * p, Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj, * pFanin;
    int i, k;
    Abc_NtkForEachNode( pNtk, pObj, i )
        Abc_ObjForEachFanin( pObj, pFanin, k )
            if ( Abc_ObjIsNode(pFanin) && Abc_ObjFanoutNum(pFanin) == 1 )
                Abc_SclCheckCommonInputs( pObj, pFanin );
}